

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDefs.cpp
# Opt level: O0

void vk::checkResult(VkResult result,char *msg,char *file,int line)

{
  bool bVar1;
  ostream *poVar2;
  OutOfMemoryError *this;
  Error *this_00;
  char *pcVar3;
  Enum<vk::VkResult,_4UL> EVar4;
  Enum<vk::VkResult,_4UL> local_1c0 [2];
  ostringstream local_1a0 [8];
  ostringstream msgStr;
  int line_local;
  char *file_local;
  char *msg_local;
  VkResult result_local;
  
  if (result == VK_SUCCESS) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (msg != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)local_1a0,msg);
    std::operator<<(poVar2,": ");
  }
  EVar4 = getResultStr(result);
  local_1c0[0].m_getName = EVar4.m_getName;
  local_1c0[0].m_value = EVar4.m_value;
  tcu::Format::operator<<((ostream *)local_1a0,local_1c0);
  bVar1 = isOutOfMemoryError(result);
  if (!bVar1) {
    this_00 = (Error *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Error::Error(this_00,result,pcVar3,(char *)0x0,file,line);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  OutOfMemoryError::OutOfMemoryError(this,result,pcVar3,(char *)0x0,file,line);
  __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
}

Assistant:

void checkResult (VkResult result, const char* msg, const char* file, int line)
{
	if (result != VK_SUCCESS)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << getResultStr(result);

		if (isOutOfMemoryError(result))
			throw OutOfMemoryError(result, msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(result, msgStr.str().c_str(), DE_NULL, file, line);
	}
}